

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageSyncCS::Run(AdvancedUsageSyncCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  char *format;
  ulong uStack_70;
  allocator<char> local_5d;
  uint local_5c;
  int data [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)data,
             "\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 0) coherent buffer Buffer0 {\n  int g_data0, g_inc0;\n  int g_data1, g_inc1;\n};\nlayout(std430, binding = 1) buffer Buffer12 {\n  int inc, data;\n} g_buffer12[2];\nlayout(binding = 3, std430) coherent buffer Buffer3 {\n  int data;\n} g_buffer3;\nlayout(std430, binding = 4) coherent buffer Buffer4 {\n  int data0, inc0;\n  int data1, inc1;\n} g_buffer4;\nlayout(std430, binding = 5) buffer Buffer56 {\n  int inc, data;\n} g_buffer56[2];\n\nvoid Modify1(int path) {\n  if (path == 0) {\n    atomicAdd(g_data0, g_inc0);\n    atomicAdd(g_data1, g_inc0);\n  } else if (path == 1) {\n    atomicAdd(g_data0, - g_inc0);\n    atomicAdd(g_data1, - g_inc0);\n  } else if (path == 2) {\n    atomicAdd(g_data0, g_inc1);\n    atomicAdd(g_data1, g_inc1);\n  }\n  if (path == 0) {\n    g_buffer12[0].data += g_buffer12[1].inc;\n  } else if (path == 1) {\n    g_buffer12[1].data += g_buffer12[0].inc;\n  }\n}\n\nvoid Modify2(int path) {\n  if (path == 0) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc0);\n  } else if (path == 1) {\n    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);\n  } else if (path == 2) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc1);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc1);\n  }\n  if (path == 0) {\n    g_buffer56[0].data += g_buffer56[1].inc;\n  } else if (path == 1) {\n    g_buffer56[1].data += g_buffer56[0].inc;\n  }\n}\n\nvoid main() {\n  Modify1(int(gl_WorkGroupID.z));\n  atomicAdd(g_buffer3.data, 1);\n  Modify2(int(gl_WorkGroupID.z));\n}"
             ,&local_5d);
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,(string *)data);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)data);
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (!bVar1) {
    return -1;
  }
  glu::CallLogWrapper::glGenBuffers(this_00,7,this->m_storage_buffer);
  data[0] = 0;
  data[1] = 1;
  data[2] = 0;
  data[3] = 2;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data,0x88ea);
  data[0] = 3;
  data[1] = 1;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,data,0x88ea);
  data[0] = 2;
  data[1] = 4;
  local_5c = 2;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,data,0x88ea);
  data._0_8_ = data._0_8_ & 0xffffffff00000000;
  uStack_70 = 3;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,data,0x88ea);
  data[0] = 0;
  data[1] = 1;
  data[2] = 0;
  data[3] = 2;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data,0x88ea);
  data[0] = 3;
  data[1] = 1;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,5,this->m_storage_buffer[5]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,data,0x88ea);
  data[0] = 2;
  data[1] = 4;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,6,this->m_storage_buffer[6]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,data,0x88ea);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,3);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,3);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
  pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
  if (pvVar3 == (void *)0x0) {
    return -1;
  }
  puVar8 = &DAT_0169e0d0;
  for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
    uVar6 = *(uint *)((long)pvVar3 + uVar7 * 4);
    uVar5 = *puVar8;
    if (uVar6 != uVar5) {
      format = "[Buffer0] Data at index %d is %d should be %d.\n";
      goto LAB_00a10dbf;
    }
    puVar8 = puVar8 + 1;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
  puVar8 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
  if (puVar8 == (uint *)0x0) {
    return -1;
  }
  uVar6 = *puVar8;
  uVar5 = 0;
  if (uVar6 == 3) {
    uVar6 = puVar8[1];
    uStack_70 = 5;
    uVar5 = 1;
    if (uVar6 == 5) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
      puVar8 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
      if (puVar8 == (uint *)0x0) {
        return -1;
      }
      uVar6 = *puVar8;
      uVar5 = 0;
      if (uVar6 == 2) {
        uVar6 = puVar8[1];
        if (uVar6 == 10) {
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
          puVar8 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
          if (puVar8 == (uint *)0x0) {
            return -1;
          }
          uVar4 = (ulong)*puVar8;
          if (*puVar8 != 6) {
            format = "[Buffer3] Data at index %d is %d should be %d.\n";
            uStack_70 = 6;
            uVar7 = 0;
            goto LAB_00a10dcd;
          }
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
          pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
          if (pvVar3 == (void *)0x0) {
            return -1;
          }
          puVar8 = &DAT_0169e0d0;
          for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
            uVar6 = *(uint *)((long)pvVar3 + uVar7 * 4);
            uVar5 = *puVar8;
            if (uVar6 != uVar5) {
              format = "[Buffer4] Data at index %d is %d should be %d.\n";
LAB_00a10dbf:
              uVar4 = (ulong)uVar6;
              uStack_70 = (ulong)uVar5;
              goto LAB_00a10dcd;
            }
            puVar8 = puVar8 + 1;
          }
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[5]);
          uVar6 = 0;
          puVar8 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
          if (puVar8 == (uint *)0x0) {
            return -1;
          }
          uVar5 = *puVar8;
          if (uVar5 == 3) {
            uVar5 = puVar8[1];
            if (uVar5 != 5) {
              uStack_70 = 5;
              uVar6 = 1;
              goto LAB_00a10ed5;
            }
            glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
            glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[6]);
            uVar6 = 0;
            puVar8 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
            if (puVar8 == (uint *)0x0) {
              return -1;
            }
            uVar5 = *puVar8;
            if (uVar5 == 2) {
              uVar5 = puVar8[1];
              if (uVar5 == 10) {
                glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                return 0;
              }
              uStack_70 = 10;
              uVar6 = 1;
            }
            else {
              uStack_70 = 2;
            }
            format = "[Buffer6] Data at index %d is %d should be %d.\n";
          }
          else {
            uStack_70 = 3;
LAB_00a10ed5:
            format = "[Buffer5] Data at index %d is %d should be %d.\n";
          }
          uVar4 = (ulong)uVar5;
          uVar7 = (ulong)uVar6;
          goto LAB_00a10dcd;
        }
        local_5c = 10;
        uVar5 = 1;
      }
      uVar4 = (ulong)uVar6;
      format = "[Buffer2] Data at index %d is %d should be %d.\n";
      uVar7 = (ulong)uVar5;
      uStack_70 = (ulong)local_5c;
      goto LAB_00a10dcd;
    }
  }
  uVar4 = (ulong)uVar6;
  format = "[Buffer1] Data at index %d is %d should be %d.\n";
  uVar7 = (ulong)uVar5;
LAB_00a10dcd:
  anon_unknown_0::Output(format,uVar7,uVar4,uStack_70);
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430, binding = 0) coherent buffer Buffer0 {" NL
			   "  int g_data0, g_inc0;" NL "  int g_data1, g_inc1;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer12 {" NL "  int inc, data;" NL "} g_buffer12[2];" NL
			   "layout(binding = 3, std430) coherent buffer Buffer3 {" NL "  int data;" NL "} g_buffer3;" NL
			   "layout(std430, binding = 4) coherent buffer Buffer4 {" NL "  int data0, inc0;" NL
			   "  int data1, inc1;" NL "} g_buffer4;" NL "layout(std430, binding = 5) buffer Buffer56 {" NL
			   "  int inc, data;" NL "} g_buffer56[2];" NL NL "void Modify1(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_data0, g_inc0);" NL "    atomicAdd(g_data1, g_inc0);" NL "  } else if (path == 1) {" NL
			   "    atomicAdd(g_data0, - g_inc0);" NL "    atomicAdd(g_data1, - g_inc0);" NL
			   "  } else if (path == 2) {" NL "    atomicAdd(g_data0, g_inc1);" NL "    atomicAdd(g_data1, g_inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer12[0].data += g_buffer12[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer12[1].data += g_buffer12[0].inc;" NL "  }" NL "}" NL NL
			   "void Modify2(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc0);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc0);" NL
			   "  } else if (path == 1) {" NL "    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);" NL
			   "    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);" NL "  } else if (path == 2) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc1);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer56[0].data += g_buffer56[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer56[1].data += g_buffer56[0].inc;" NL "  }" NL "}" NL NL
			   "void main() {" NL "  Modify1(int(gl_WorkGroupID.z));" NL "  atomicAdd(g_buffer3.data, 1);" NL
			   "  Modify2(int(gl_WorkGroupID.z));" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(7, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer2 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer3 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer4 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer5 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 5, m_storage_buffer[5]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer6 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 6, m_storage_buffer[6]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);

		glDispatchCompute(1, 1, 3);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchCompute(1, 1, 3);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer1 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer2 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer2] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer3 */
		{
			const int ref_data[1] = { 6 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer3] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer4 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer4] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer5 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[5]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer5] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer6 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer6] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		return NO_ERROR;
	}